

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O0

int __thiscall TrodesConfig::copy(TrodesConfig *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int iVar1;
  NTrodeObj *pNVar2;
  size_type sVar3;
  int i_1;
  int i;
  TrodesConfig *newObj;
  NDevice *in_stack_ffffffffffffff08;
  NDevice *in_stack_ffffffffffffff10;
  NDevice *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  int iVar4;
  NDevice local_b8;
  int local_6c;
  NDevice local_68;
  int local_20;
  NTrodeObj *local_10;
  TrodesConfig *local_8;
  
  local_8 = this;
  pNVar2 = (NTrodeObj *)operator_new(0x38);
  TrodesConfig((TrodesConfig *)in_stack_ffffffffffffff10);
  local_20 = 0;
  local_10 = pNVar2;
  while( true ) {
    iVar4 = local_20;
    sVar3 = std::vector<NDevice,_std::allocator<NDevice>_>::size(&this->devices);
    if ((int)sVar3 <= iVar4) break;
    std::vector<NDevice,_std::allocator<NDevice>_>::at
              ((vector<NDevice,_std::allocator<NDevice>_> *)in_stack_ffffffffffffff10,
               (size_type)in_stack_ffffffffffffff08);
    in_stack_ffffffffffffff28 = &local_68;
    NDevice::NDevice((NDevice *)CONCAT44(iVar4,in_stack_ffffffffffffff30),in_stack_ffffffffffffff28)
    ;
    addDevice((TrodesConfig *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    NDevice::~NDevice(in_stack_ffffffffffffff10);
    local_20 = local_20 + 1;
  }
  local_6c = 0;
  while( true ) {
    iVar1 = local_6c;
    sVar3 = std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>::size(&this->nTrodes);
    if ((int)sVar3 <= iVar1) break;
    pNVar2 = local_10;
    std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>::at
              ((vector<NTrodeObj,_std::allocator<NTrodeObj>_> *)in_stack_ffffffffffffff10,
               (size_type)local_10);
    in_stack_ffffffffffffff10 = &local_b8;
    NTrodeObj::NTrodeObj
              ((NTrodeObj *)CONCAT44(iVar4,in_stack_ffffffffffffff30),
               (NTrodeObj *)in_stack_ffffffffffffff28);
    addNTrode((TrodesConfig *)in_stack_ffffffffffffff10,pNVar2);
    NTrodeObj::~NTrodeObj((NTrodeObj *)in_stack_ffffffffffffff10);
    local_6c = local_6c + 1;
  }
  return (int)local_10;
}

Assistant:

TrodesConfig* TrodesConfig::copy() const {
    TrodesConfig* newObj = new TrodesConfig();
//    TrodesConfig newObj

    for (int i = 0; i < (int)devices.size(); i++) {
        newObj->addDevice(devices.at(i));
    }
    for (int i = 0; i < (int)nTrodes.size(); i++) {
        newObj->addNTrode(nTrodes.at(i));
    }
    return(newObj);
}